

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderSwitchTests.cpp
# Opt level: O0

void deqp::makeSwitchCases
               (TestCaseGroup *group,GLSLVersion glslVersion,char *name,char *desc,
               LineStream *switchBody)

{
  GLSLVersion GVar1;
  TestCaseGroup *pTVar2;
  Context *pCVar3;
  char *pcVar4;
  TestNode *pTVar5;
  allocator<char> local_151;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  allocator<char> local_b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  SwitchType local_34;
  LineStream *pLStack_30;
  int type;
  LineStream *switchBody_local;
  char *desc_local;
  char *name_local;
  TestCaseGroup *pTStack_10;
  GLSLVersion glslVersion_local;
  TestCaseGroup *group_local;
  
  pLStack_30 = switchBody;
  switchBody_local = (LineStream *)desc;
  desc_local = name;
  name_local._4_4_ = glslVersion;
  pTStack_10 = group;
  for (local_34 = SWITCHTYPE_STATIC; pTVar2 = pTStack_10, (int)local_34 < 3;
      local_34 = local_34 + SWITCHTYPE_UNIFORM) {
    pCVar3 = TestCaseGroup::getContext(pTStack_10);
    GVar1 = name_local._4_4_;
    pcVar4 = desc_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,pcVar4,&local_b9);
    std::operator+(&local_98,&local_b8,"_");
    std::operator+(&local_78,&local_98,makeSwitchCases::switchTypeNames[(int)local_34]);
    std::operator+(&local_58,&local_78,"_vertex");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pTVar5 = &makeSwitchCase(pCVar3,GVar1,pcVar4,(char *)switchBody_local,local_34,true,pLStack_30)
              ->super_TestNode;
    tcu::TestNode::addChild((TestNode *)pTVar2,pTVar5);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::allocator<char>::~allocator(&local_b9);
    pTVar2 = pTStack_10;
    pCVar3 = TestCaseGroup::getContext(pTStack_10);
    GVar1 = name_local._4_4_;
    pcVar4 = desc_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,pcVar4,&local_151);
    std::operator+(&local_130,&local_150,"_");
    std::operator+(&local_110,&local_130,makeSwitchCases::switchTypeNames[(int)local_34]);
    std::operator+(&local_f0,&local_110,"_fragment");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pTVar5 = &makeSwitchCase(pCVar3,GVar1,pcVar4,(char *)switchBody_local,local_34,false,pLStack_30)
              ->super_TestNode;
    tcu::TestNode::addChild((TestNode *)pTVar2,pTVar5);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  return;
}

Assistant:

static void makeSwitchCases(TestCaseGroup* group, glu::GLSLVersion glslVersion, const char* name, const char* desc,
							const LineStream& switchBody)
{
	static const char* switchTypeNames[] = { "static", "uniform", "dynamic" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(switchTypeNames) == SWITCHTYPE_LAST);

	for (int type = 0; type < SWITCHTYPE_LAST; type++)
	{
		group->addChild(makeSwitchCase(group->getContext(), glslVersion,
									   (string(name) + "_" + switchTypeNames[type] + "_vertex").c_str(), desc,
									   (SwitchType)type, true, switchBody));
		group->addChild(makeSwitchCase(group->getContext(), glslVersion,
									   (string(name) + "_" + switchTypeNames[type] + "_fragment").c_str(), desc,
									   (SwitchType)type, false, switchBody));
	}
}